

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

bool __thiscall
QXmlStreamReaderPrivate::scanUntil(QXmlStreamReaderPrivate *this,char *str,short tokenToInject)

{
  QChar c_00;
  QChar c_01;
  QStringView s;
  bool bVar1;
  storage_type_conflict *psVar2;
  short in_DX;
  char *in_RSI;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  uint c;
  qint64 oldLineNumber;
  qsizetype pos;
  undefined4 in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff4c;
  ushort in_stack_ffffffffffffff4e;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  QStringView *in_stack_ffffffffffffff60;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff78;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff80;
  uint local_74;
  qsizetype qVar3;
  bool local_41;
  QChar local_2a [16];
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = (storage_type_conflict *)QString::size(&in_RDI->textBuffer);
  qVar3 = in_RDI->lineNumber;
  do {
    do {
      while( true ) {
        local_74 = getChar(in_RDI);
        if (local_74 == 0xffffffff) {
          QStringView::QStringView<QString,_true>
                    (in_stack_ffffffffffffff60,
                     (QString *)
                     CONCAT17(in_stack_ffffffffffffff5f,
                              CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
          s.m_data = psVar2;
          s.m_size = qVar3;
          putString(in_stack_ffffffffffffff78,s,(qsizetype)in_RDI);
          QString::resize((QString *)in_stack_ffffffffffffff50,
                          CONCAT26(in_stack_ffffffffffffff4e,
                                   CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
          in_RDI->lineNumber = qVar3;
          local_41 = false;
          goto LAB_00643820;
        }
        if (local_74 != 9) break;
LAB_00643657:
        QChar::QChar<unsigned_int,_true>(&local_a,local_74);
        c_00.ucs._1_1_ = in_stack_ffffffffffffff5f;
        c_00.ucs._0_1_ = in_stack_ffffffffffffff5e;
        QString::operator+=((QString *)in_stack_ffffffffffffff50,c_00);
      }
      if (local_74 == 10) {
LAB_0064362b:
        in_RDI->lineNumber = in_RDI->lineNumber + 1;
        in_RDI->lastLineStart = in_RDI->characterOffset + in_RDI->readBufferPos;
        goto LAB_00643657;
      }
      if (local_74 == 0xd) {
        local_74 = filterCarriageReturn
                             ((QXmlStreamReaderPrivate *)
                              CONCAT17(in_stack_ffffffffffffff5f,
                                       CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)
                                      ));
        if (local_74 != 0) goto LAB_0064362b;
        local_74 = 0;
      }
      else {
        if ((local_74 < 0x20) ||
           (((0xfffd < local_74 && (local_74 < 0x10000)) || (0x10ffff < local_74)))) {
          QXmlStream::tr((char *)CONCAT17(in_stack_ffffffffffffff5f,
                                          CONCAT16(in_stack_ffffffffffffff5e,
                                                   in_stack_ffffffffffffff58)),
                         (char *)in_stack_ffffffffffffff50,
                         CONCAT22(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff4c));
          raiseWellFormedError
                    (in_stack_ffffffffffffff50,
                     (QString *)
                     CONCAT26(in_stack_ffffffffffffff4e,
                              CONCAT24(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)));
          QString::~QString((QString *)0x6436eb);
          in_RDI->lineNumber = qVar3;
          local_41 = false;
          goto LAB_00643820;
        }
        QChar::QChar<unsigned_int,_true>(local_2a,local_74);
        c_01.ucs._1_1_ = in_stack_ffffffffffffff5f;
        c_01.ucs._0_1_ = in_stack_ffffffffffffff5e;
        QString::operator+=((QString *)in_stack_ffffffffffffff50,c_01);
      }
    } while (local_74 != (int)*in_RSI);
    if (in_RSI[1] == '\0') {
      if (-1 < in_DX) {
        injectToken(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4e);
      }
      local_41 = true;
      goto LAB_00643820;
    }
    bVar1 = scanString(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                       (short)((ulong)in_RDI >> 0x30),SUB81((ulong)in_RDI >> 0x28,0));
    if (bVar1) {
      local_41 = true;
LAB_00643820:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_41;
    }
  } while( true );
}

Assistant:

bool QXmlStreamReaderPrivate::scanUntil(const char *str, short tokenToInject)
{
    const qsizetype pos = textBuffer.size();
    const auto oldLineNumber = lineNumber;

    uint c;
    while ((c = getChar()) != StreamEOF) {
        /* First, we do the validation & normalization. */
        switch (c) {
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                break;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case '\t':
            textBuffer += QChar(c);
            continue;
        default:
            if (c < 0x20 || (c > 0xFFFD && c < 0x10000) || c > QChar::LastValidCodePoint ) {
                raiseWellFormedError(QXmlStream::tr("Invalid XML character."));
                lineNumber = oldLineNumber;
                return false;
            }
            textBuffer += QChar(c);
        }


        /* Second, attempt to lookup str. */
        if (c == uint(*str)) {
            if (!*(str + 1)) {
                if (tokenToInject >= 0)
                    injectToken(tokenToInject);
                return true;
            } else {
                if (scanString(str + 1, tokenToInject, false))
                    return true;
            }
        }
    }
    putString(textBuffer, pos);
    textBuffer.resize(pos);
    lineNumber = oldLineNumber;
    return false;
}